

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Assembly.h
# Opt level: O3

void __thiscall Instruction::Instruction(Instruction *this,string *op,string *name1,string *name2)

{
  pointer pcVar1;
  
  (this->label)._M_dataplus._M_p = (pointer)&(this->label).field_2;
  (this->label)._M_string_length = 0;
  (this->label).field_2._M_local_buf[0] = '\0';
  (this->op)._M_dataplus._M_p = (pointer)&(this->op).field_2;
  pcVar1 = (op->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->op,pcVar1,pcVar1 + op->_M_string_length);
  (this->name1)._M_dataplus._M_p = (pointer)&(this->name1).field_2;
  pcVar1 = (name1->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->name1,pcVar1,pcVar1 + name1->_M_string_length);
  (this->name2)._M_dataplus._M_p = (pointer)&(this->name2).field_2;
  pcVar1 = (name2->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->name2,pcVar1,pcVar1 + name2->_M_string_length);
  return;
}

Assistant:

Instruction(string op, string name1, string name2): op(op), name1(name1), name2(name2), label()  {}